

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

int induced_align(d_level *dlev,int pct)

{
  char cVar1;
  int iVar2;
  s_level *psVar3;
  uint local_34;
  uint local_30;
  aligntyp al;
  s_level *lev;
  int pct_local;
  d_level *dlev_local;
  
  psVar3 = Is_special(dlev);
  if (((psVar3 == (s_level *)0x0) || ((*(byte *)&psVar3->flags >> 4 & 7) == 0)) ||
     (iVar2 = rn2(100), pct <= iVar2)) {
    if (((*(byte *)&dungeons[dlev->dnum].flags >> 4 & 7) == 0) || (iVar2 = rn2(100), pct <= iVar2))
    {
      iVar2 = rn2(3);
      cVar1 = (char)iVar2 + -1;
      if (cVar1 == -0x80) {
        local_30 = 0;
      }
      else {
        if (cVar1 == '\x01') {
          local_34 = 4;
        }
        else {
          local_34 = (int)cVar1 + 2;
        }
        local_30 = local_34;
      }
      dlev_local._4_4_ = local_30;
    }
    else {
      dlev_local._4_4_ = (uint)(*(byte *)&dungeons[dlev->dnum].flags >> 4 & 7);
    }
  }
  else {
    dlev_local._4_4_ = (uint)(*(byte *)&psVar3->flags >> 4 & 7);
  }
  return dlev_local._4_4_;
}

Assistant:

int induced_align(const d_level *dlev, int pct)
{
	s_level	*lev = Is_special(dlev);
	aligntyp al;

	if (lev && lev->flags.align)
		if (rn2(100) < pct) return lev->flags.align;

	if (dungeons[dlev->dnum].flags.align)
		if (rn2(100) < pct) return dungeons[dlev->dnum].flags.align;

	al = rn2(3) - 1;
	return Align2amask(al);
}